

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

int exp_check_token(ly_ctx *ctx,lyxp_expr *exp,uint16_t exp_idx,lyxp_token want_tok,int strict)

{
  char *pcVar1;
  int iVar2;
  
  if (exp->used == exp_idx) {
    iVar2 = -1;
    if (strict != 0) {
      ly_vlog(ctx,LYE_XPATH_EOF,LY_VLOG_NONE,(void *)0x0);
    }
  }
  else {
    iVar2 = 0;
    if (want_tok != LYXP_TOKEN_NONE) {
      iVar2 = 0;
      if ((exp->tokens[exp_idx] != want_tok) && (iVar2 = -1, strict != 0)) {
        pcVar1 = print_token(exp->tokens[exp_idx]);
        ly_vlog(ctx,LYE_XPATH_INTOK,LY_VLOG_NONE,(void *)0x0,pcVar1,
                exp->expr + exp->expr_pos[exp_idx]);
      }
    }
  }
  return iVar2;
}

Assistant:

static int
exp_check_token(struct ly_ctx *ctx, struct lyxp_expr *exp, uint16_t exp_idx, enum lyxp_token want_tok, int strict)
{
    if (exp->used == exp_idx) {
        if (strict) {
            LOGVAL(ctx, LYE_XPATH_EOF, LY_VLOG_NONE, NULL);
        }
        return -1;
    }

    if (want_tok && (exp->tokens[exp_idx] != want_tok)) {
        if (strict) {
            LOGVAL(ctx, LYE_XPATH_INTOK, LY_VLOG_NONE, NULL,
                   print_token(exp->tokens[exp_idx]), &exp->expr[exp->expr_pos[exp_idx]]);
        }
        return -1;
    }

    return EXIT_SUCCESS;
}